

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxEpsRefine.h
# Opt level: O2

dfa_t * __thiscall
covenant::MaxEpsRefine<covenant::Sym>::maximum_refinement
          (dfa_t *__return_storage_ptr__,MaxEpsRefine<covenant::Sym> *this,cond_eps_gen_t *gen,
          int qi,int qj)

{
  bool bVar1;
  int iVar2;
  int qi_00;
  dfa_t include_dfa;
  dfa_t local_110;
  dfa_t local_a0;
  
  iVar2 = gen->nstates;
  if (iVar2 < qi) {
    CondEpsGen<covenant::Sym>::emit_dfa(__return_storage_ptr__,gen);
    return __return_storage_ptr__;
  }
  if (iVar2 <= qj) {
    __assert_fail("qj < gen.nStates()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/refinement/MaxEpsRefine.h"
                  ,0x31,
                  "dfa_t covenant::MaxEpsRefine<covenant::Sym>::maximum_refinement(cond_eps_gen_t &, int, int) [EdgeSym = covenant::Sym]"
                 );
  }
  iVar2 = (qj + 1) % iVar2;
  qi_00 = qi + (uint)(iVar2 == 0);
  maximum_refinement(__return_storage_ptr__,this,gen,qi_00,iVar2);
  DFA<covenant::Sym>::eps_elim(__return_storage_ptr__);
  CondEpsGen<covenant::Sym>::push(gen);
  if (qi < qj) {
    bVar1 = CondEpsGen<covenant::Sym>::addEpsTrans(gen,qi,qj);
    if (!bVar1) goto LAB_00164dff;
    maximum_refinement(&include_dfa,this,gen,qi_00,iVar2);
    DFA<covenant::Sym>::eps_elim(&include_dfa);
    DFA<covenant::Sym>::nondet_union(__return_storage_ptr__,&include_dfa);
    DFA<covenant::Sym>::makeDFA(&local_110,__return_storage_ptr__,this->alphstart,this->alphsz);
    DFA<covenant::Sym>::minimize(&local_a0,&local_110,this->alphstart,this->alphsz);
  }
  else {
    if ((qi <= qj) ||
       (bVar1 = CondEpsGen<covenant::Sym>::addTrans
                          (gen,qi + -1,
                           (gen->word).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)qi + -1],qj), !bVar1))
    goto LAB_00164dff;
    maximum_refinement(&include_dfa,this,gen,qi_00,iVar2);
    DFA<covenant::Sym>::eps_elim(&include_dfa);
    DFA<covenant::Sym>::nondet_union(__return_storage_ptr__,&include_dfa);
    DFA<covenant::Sym>::makeDFA(&local_110,__return_storage_ptr__,this->alphstart,this->alphsz);
    DFA<covenant::Sym>::minimize(&local_a0,&local_110,this->alphstart,this->alphsz);
  }
  DFA<covenant::Sym>::operator=(__return_storage_ptr__,&local_a0);
  DFA<covenant::Sym>::~DFA(&local_a0);
  DFA<covenant::Sym>::~DFA(&local_110);
  DFA<covenant::Sym>::~DFA(&include_dfa);
LAB_00164dff:
  CondEpsGen<covenant::Sym>::pop(gen);
  return __return_storage_ptr__;
}

Assistant:

dfa_t maximum_refinement(cond_eps_gen_t& gen, int qi, int qj)
    {
      if(qi > gen.nStates())
        return gen.emit_dfa();
      assert(qj < gen.nStates());

      int qj_next = (qj+1)%gen.nStates();
      int qi_next = (qj_next == 0) ? qi+1 : qi;
      
      dfa_t ret_dfa(maximum_refinement(gen, qi_next, qj_next));
      ret_dfa.eps_elim();

      gen.push();

      if(qi < qj)
      {
        // Forwards; an epsilon transition
        if(gen.addEpsTrans(qi, qj))
        {
          dfa_t include_dfa(maximum_refinement(gen, qi_next, qj_next));
          include_dfa.eps_elim();
          ret_dfa.nondet_union(include_dfa);
#if 1
          // Important to keep smaller the automata
          ret_dfa = ret_dfa.makeDFA (alphstart, alphsz).
              minimize (alphstart, alphsz);
              
#endif 
 
        }
      } 
      else if (qj < qi) {
        // Backwards, an input-consuming transition 
        if(gen.addTrans(qi-1, gen.word[qi-1], qj))
        {
          dfa_t include_dfa(maximum_refinement(gen, 
                                               qi_next, 
                                               qj_next));
          include_dfa.eps_elim();
          ret_dfa.nondet_union (include_dfa);
#if 1
          // Important to keep smaller the automata
          ret_dfa = ret_dfa.makeDFA (alphstart, alphsz).
              minimize (alphstart, alphsz);
#endif 
        } 
      }
      gen.pop();
      
      return ret_dfa;
    }